

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O0

void __thiscall bdQueryHistory::printMsgs(bdQueryHistory *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  size_type sVar4;
  _Self local_30;
  _Base_ptr local_28;
  _Rb_tree_iterator<std::pair<const_bdId,_bdQueryHistoryList>_> local_20;
  iterator it;
  ostream *out;
  bdQueryHistory *this_local;
  
  it._M_node = (_Base_ptr)&std::cerr;
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "bdQueryHistory::printMsgs() IncomingQueries in last ");
  std::ostream::operator<<(poVar2,this->mStorePeriod);
  poVar2 = std::operator<<((ostream *)&std::cerr," secs");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::_Rb_tree_iterator<std::pair<const_bdId,_bdQueryHistoryList>_>::_Rb_tree_iterator(&local_20);
  local_28 = (_Base_ptr)
             std::
             map<bdId,_bdQueryHistoryList,_std::less<bdId>,_std::allocator<std::pair<const_bdId,_bdQueryHistoryList>_>_>
             ::begin(&this->mHistory);
  local_20._M_node = local_28;
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<bdId,_bdQueryHistoryList,_std::less<bdId>,_std::allocator<std::pair<const_bdId,_bdQueryHistoryList>_>_>
         ::end(&this->mHistory);
    bVar1 = std::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    std::operator<<((ostream *)&std::cerr,"\t");
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_bdId,_bdQueryHistoryList>_>::operator->
                       (&local_20);
    bdStdPrintId((ostream *)&std::cerr,&ppVar3->first);
    poVar2 = std::operator<<((ostream *)&std::cerr," ");
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_bdId,_bdQueryHistoryList>_>::operator->
                       (&local_20);
    sVar4 = std::
            multimap<long,_bdNodeId,_std::less<long>,_std::allocator<std::pair<const_long,_bdNodeId>_>_>
            ::size(&(ppVar3->second).mList);
    std::ostream::operator<<(poVar2,sVar4);
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_bdId,_bdQueryHistoryList>_>::operator->
                       (&local_20);
    if (((ppVar3->second).mBadPeer & 1U) != 0) {
      std::operator<<((ostream *)&std::cerr," BadPeer");
    }
    std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
    std::_Rb_tree_iterator<std::pair<const_bdId,_bdQueryHistoryList>_>::operator++(&local_20,0);
  }
  return;
}

Assistant:

void bdQueryHistory::printMsgs() {
	std::ostream &out = std::cerr;

	out << "bdQueryHistory::printMsgs() IncomingQueries in last " << mStorePeriod;
	out << " secs" << std::endl;

	std::map<bdId, bdQueryHistoryList>::iterator it;
	for (it = mHistory.begin(); it != mHistory.end(); it++) {
		out << "\t";
		bdStdPrintId(out, &(it->first));
		out << " " << it->second.mList.size();
		if (it->second.mBadPeer)
			out << " BadPeer";
		out << std::endl;
	}
}